

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O2

void intgemm::kernel_write_test<(intgemm::CPUType)4,signed_char>(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  long lVar9;
  char local_f1 [9];
  AlignedVector<signed_char> input;
  AlignedVector<signed_char> output;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_signed_char_&,_const_signed_char_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&input,0x40,0x40);
    AlignedVector<signed_char>::AlignedVector(&output,0x40,0x40);
    for (sVar8 = 0; input.size_ != sVar8; sVar8 = sVar8 + 1) {
      input.mem_[sVar8] = (char)sVar8;
    }
    uVar1 = *(undefined8 *)(input.mem_ + 8);
    uVar2 = *(undefined8 *)(input.mem_ + 0x10);
    uVar3 = *(undefined8 *)(input.mem_ + 0x18);
    uVar4 = *(undefined8 *)(input.mem_ + 0x20);
    uVar5 = *(undefined8 *)(input.mem_ + 0x28);
    uVar6 = *(undefined8 *)(input.mem_ + 0x30);
    uVar7 = *(undefined8 *)(input.mem_ + 0x38);
    *(undefined8 *)output.mem_ = *(undefined8 *)input.mem_;
    *(undefined8 *)(output.mem_ + 8) = uVar1;
    *(undefined8 *)(output.mem_ + 0x10) = uVar2;
    *(undefined8 *)(output.mem_ + 0x18) = uVar3;
    *(undefined8 *)(output.mem_ + 0x20) = uVar4;
    *(undefined8 *)(output.mem_ + 0x28) = uVar5;
    *(undefined8 *)(output.mem_ + 0x30) = uVar6;
    *(undefined8 *)(output.mem_ + 0x38) = uVar7;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_b8,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = output.mem_ + lVar9;
      local_f1[0] = (char)lVar9;
      Catch::ExprLhs<signed_char_const&>::operator==
                (&local_a8,(ExprLhs<signed_char_const&> *)&local_c8,local_f1);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}